

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityMarking *this)

{
  ostream *poVar1;
  size_t sVar2;
  KINT32 Value;
  KStringStream ss;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Entity Marking:",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n\tMaring Char Set:      ",0x18);
  ENUMS::GetEnumAsStringEntityMarkingCharacterSet_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui8EntityMarkingCharacterSet,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tMarking String:       ",0x18);
  local_1f0 = local_1e0;
  sVar2 = strlen(this->m_sEntityMarkingString);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,this->m_sEntityMarkingString,this->m_sEntityMarkingString + sVar2)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1f0,local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

KString EntityMarking::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Marking:"
       << "\n\tMaring Char Set:      " << GetEnumAsStringEntityMarkingCharacterSet( m_ui8EntityMarkingCharacterSet )
       << "\n\tMarking String:       " << GetEntityMarkingString()
       << "\n";

    return ss.str();
}